

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O2

void __thiscall
kj::_::HeapDisposer<kj::(anonymous_namespace)::TransitionaryAsyncIoStream>::disposeImpl
          (HeapDisposer<kj::(anonymous_namespace)::TransitionaryAsyncIoStream> *this,void *pointer)

{
  if (pointer != (void *)0x0) {
    Own<kj::PausableReadAsyncIoStream,_std::nullptr_t>::dispose
              ((Own<kj::PausableReadAsyncIoStream,_std::nullptr_t> *)((long)pointer + 0x10));
    AsyncIoStream::~AsyncIoStream((AsyncIoStream *)pointer);
  }
  operator_delete(pointer,0x20);
  return;
}

Assistant:

virtual void disposeImpl(void* pointer) const override { delete reinterpret_cast<T*>(pointer); }